

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

size_t CLI::detail::close_sequence(string *str,size_t start,char closure_char)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  string *psVar4;
  const_reference pvVar5;
  reference pvVar6;
  size_type sVar7;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t loc;
  string closures;
  size_type bracket_loc;
  size_type in_stack_ffffffffffffff28;
  string *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  char cVar9;
  string *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string *local_68;
  allocator<char> local_49 [33];
  size_type local_28;
  string *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  string *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                       (in_stack_ffffffffffffff70,(char)((uint)in_stack_ffffffffffffff6c >> 0x18),
                        in_stack_ffffffffffffff60);
  cVar9 = (char)((ulong)in_stack_ffffffffffffff30 >> 0x38);
  if (local_28 != 0xffffffffffffffff) {
    if (local_28 == 0) {
      sVar3 = close_string_quote(in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38,cVar9);
      return sVar3;
    }
    if (1 < local_28 - 1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 (char)((ulong)in_stack_ffffffffffffff40 >> 0x38),
                 (allocator<char> *)in_stack_ffffffffffffff38);
      ::std::allocator<char>::~allocator(local_49);
      while( true ) {
        local_68 = (string *)((long)&(local_18->_M_dataplus)._M_p + 1);
        psVar8 = local_68;
        psVar4 = (string *)
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 size(local_10);
        if (psVar4 <= psVar8) break;
        pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        iVar2 = (int)*pvVar5;
        pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 back(in_stack_ffffffffffffff30);
        if (iVar2 == *pvVar6) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                    (in_stack_ffffffffffffff30);
          bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x1cc556);
          if (bVar1) goto LAB_001cc72c;
        }
        cVar9 = (char)((uint)iVar2 >> 0x18);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(psVar8,cVar9,in_stack_ffffffffffffff60);
        local_28 = sVar7;
        local_18 = local_68;
        if (sVar7 != 0xffffffffffffffff) {
          if (sVar7 == 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
            local_18 = (string *)
                       close_string_quote(in_stack_ffffffffffffff40,
                                          (size_t)in_stack_ffffffffffffff38,
                                          (char)((ulong)in_stack_ffffffffffffff30 >> 0x38));
            in_stack_ffffffffffffff60 = sVar7;
          }
          else if (sVar7 - 1 < 2) {
            in_stack_ffffffffffffff30 = local_10;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator[](local_10,in_stack_ffffffffffffff28);
            in_stack_ffffffffffffff40 =
                 (string *)
                 close_literal_quote(in_stack_ffffffffffffff40,(size_t)local_68,
                                     (char)((ulong)in_stack_ffffffffffffff30 >> 0x38));
            in_stack_ffffffffffffff38 = local_68;
            in_stack_ffffffffffffff60 = sVar7;
            local_18 = in_stack_ffffffffffffff40;
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(in_stack_ffffffffffffff40,(char)((ulong)in_stack_ffffffffffffff38 >> 0x38));
            in_stack_ffffffffffffff60 = sVar7;
          }
        }
      }
      psVar8 = local_68;
      psVar4 = (string *)
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                         (local_10);
      if (psVar4 < psVar8) {
        local_68 = (string *)
                   std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   size(local_10);
      }
LAB_001cc72c:
      local_8 = local_68;
      ::std::__cxx11::string::~string(in_stack_ffffffffffffff30);
      return (size_t)local_8;
    }
  }
  sVar3 = close_literal_quote(in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38,cVar9);
  return sVar3;
}

Assistant:

CLI11_INLINE std::size_t close_sequence(const std::string &str, std::size_t start, char closure_char) {

    auto bracket_loc = matchBracketChars.find(closure_char);
    switch(bracket_loc) {
    case 0:
        return close_string_quote(str, start, closure_char);
    case 1:
    case 2:
    case std::string::npos:
        return close_literal_quote(str, start, closure_char);
    default:
        break;
    }

    std::string closures(1, closure_char);
    auto loc = start + 1;

    while(loc < str.size()) {
        if(str[loc] == closures.back()) {
            closures.pop_back();
            if(closures.empty()) {
                return loc;
            }
        }
        bracket_loc = bracketChars.find(str[loc]);
        if(bracket_loc != std::string::npos) {
            switch(bracket_loc) {
            case 0:
                loc = close_string_quote(str, loc, str[loc]);
                break;
            case 1:
            case 2:
                loc = close_literal_quote(str, loc, str[loc]);
                break;
            default:
                closures.push_back(matchBracketChars[bracket_loc]);
                break;
            }
        }
        ++loc;
    }
    if(loc > str.size()) {
        loc = str.size();
    }
    return loc;
}